

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

type __thiscall
nonstd::optional_lite::optional<int>::operator=(optional<int> *this,optional<int> *other)

{
  value_type_conflict5 vVar1;
  bool bVar2;
  value_type_conflict5 *pvVar3;
  optional<int> *other_local;
  optional<int> *this_local;
  
  bVar2 = has_value(this);
  if ((!bVar2) || (bVar2 = has_value(other), bVar2)) {
    bVar2 = has_value(this);
    if ((bVar2) || (bVar2 = has_value(other), !bVar2)) {
      bVar2 = has_value(this);
      if ((bVar2) && (bVar2 = has_value(other), bVar2)) {
        pvVar3 = operator*(other);
        vVar1 = *pvVar3;
        pvVar3 = detail::storage_t<int>::value((storage_t<int> *)&this->contained);
        *pvVar3 = vVar1;
      }
    }
    else {
      pvVar3 = operator*(other);
      initialize<int>(this,pvVar3);
    }
  }
  else {
    reset(this);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }